

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZendParser.cpp
# Opt level: O2

void __thiscall
phpconvert::ZendParser::processFileProcedural
          (ZendParser *this,File *file,string *tmpString,string *tmpClassNameLower,
          PreparedType *preparedType,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tmpVector,stringstream *stream)

{
  string *psVar1;
  bool bVar2;
  ZendParser *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  string *local_e8;
  string alias;
  string local_c0 [32];
  string local_a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  stringstream *local_40;
  char *local_38;
  
  this_00 = this;
  local_e8 = tmpString;
  bVar2 = isBuiltInType(this,&preparedType->type);
  if (bVar2) {
    std::operator+(&alias,"\\\\",&preparedType->type);
    std::__cxx11::string::operator=((string *)&preparedType->alias,(string *)&alias);
  }
  else {
    bVar2 = isInMainTypes(this_00,file,preparedType);
    if (bVar2) {
      std::__cxx11::string::_M_assign((string *)&preparedType->alias);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)this->builtInTypes,&preparedType->type);
      return;
    }
    bVar2 = isKeyword(this,tmpClassNameLower);
    if (bVar2) {
      generateAlias(&alias,(ZendParser *)tmpClassNameLower,tmpVector,2);
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      local_108._M_string_length = 0;
      local_108.field_2._M_local_buf[0] = '\0';
      std::__cxx11::stringbuf::str((string *)(stream + 0x18));
      std::__cxx11::string::~string((string *)&local_108);
      std::ios::clear((int)*(undefined8 *)(*(long *)stream + -0x18) + (int)stream);
      local_40 = stream + 0x10;
      local_38 = "_";
      std::
      copy<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::ostream_iterator<std::__cxx11::string,char,std::char_traits<char>>>
                (&local_108,
                 (tmpVector->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start,
                 (ostream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>_>
                  *)((tmpVector->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish + -1));
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::substr((ulong)&local_80,(ulong)local_a0);
      std::operator+(&local_60,&local_80,"_");
      std::operator+(&local_108,&local_60,&alias);
      psVar1 = local_e8;
      generateNamespace(this,&local_108,local_e8);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string(local_c0);
      std::__cxx11::string::~string(local_a0);
      std::operator+(&local_108,"\\",psVar1);
      std::__cxx11::string::operator=((string *)&preparedType->alias,(string *)&local_108);
      std::__cxx11::string::~string((string *)&local_108);
    }
    else {
      psVar1 = &preparedType->alias;
      generateNamespace(this,&preparedType->type,psVar1);
      std::operator+(&alias,"\\",psVar1);
      std::__cxx11::string::operator=((string *)psVar1,(string *)&alias);
    }
  }
  std::__cxx11::string::~string((string *)&alias);
  return;
}

Assistant:

void
    ZendParser::processFileProcedural(const BaseParser::File &file, string &tmpString, const string &tmpClassNameLower,
                                      BaseParser::PreparedType &preparedType, vector<string> &tmpVector,
                                      stringstream &stream) {
        if (isBuiltInType(preparedType)) {
            preparedType.alias = "\\\\" + preparedType.type;
        } else if (isInMainTypes(file, preparedType)) {
            preparedType.alias = preparedType.type;
            builtInTypes->insert(preparedType.type);
        } else if (isKeyword(tmpClassNameLower)) {
            string alias = generateAlias(tmpVector, 2);
            stream.str(string());
            stream.clear();
            copy(tmpVector.begin(), tmpVector.end() - 1,
                 ostream_iterator<string>(stream, DELIMETER));

            generateNamespace(
                    stream.str().substr(0, stream.str().length() - 1) + DELIMETER
                    + alias, tmpString);

            preparedType.alias = NAMESPACE_SEPARATOR + tmpString;
//				    cout <<"isKeyword alias: "<<preparedType.alias<<"\n";
        } else {
//                    cout <<"standard type alias: \n";
            generateNamespace(preparedType.type, preparedType.alias);
            preparedType.alias = NAMESPACE_SEPARATOR + preparedType.alias;
//				    cout <<preparedType.alias<<"\n";
        }
    }